

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

BOOL SetThreadContext(HANDLE hThread,CONTEXT *lpContext)

{
  BOOL BVar1;
  DWORD dwProcessId;
  pthread_t self;
  BOOL local_3c;
  IPalObject *pIStack_38;
  BOOL ret;
  IPalObject *pobjThread;
  CPalThread *pTargetThread;
  CPalThread *pThread;
  CONTEXT *pCStack_18;
  PAL_ERROR palError;
  CONTEXT *lpContext_local;
  HANDLE hThread_local;
  
  pIStack_38 = (IPalObject *)0x0;
  local_3c = 0;
  pCStack_18 = lpContext;
  lpContext_local = (CONTEXT *)hThread;
  if (PAL_InitializeChakraCoreCalled) {
    pTargetThread = CorUnix::InternalGetCurrentThread();
    pThread._4_4_ =
         CorUnix::InternalGetThreadDataFromHandle
                   (pTargetThread,lpContext_local,0,(CPalThread **)&pobjThread,
                    &stack0xffffffffffffffc8);
    if (pThread._4_4_ == 0) {
      BVar1 = CorUnix::CPalThread::IsDummy((CPalThread *)pobjThread);
      if (BVar1 == 0) {
        dwProcessId = GetCurrentProcessId();
        self = CorUnix::CPalThread::GetPThreadSelf((CPalThread *)pobjThread);
        local_3c = CONTEXT_SetThreadContext(dwProcessId,self,pCStack_18);
      }
      else {
        fprintf(_stderr,"] %s %s:%d","SetThreadContext",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
                ,0x21b);
        fprintf(_stderr,"Dummy thread handle passed to SetThreadContext\n");
        CorUnix::CPalThread::SetLastError(6);
      }
    }
    else {
      CorUnix::CPalThread::SetLastError(pThread._4_4_);
    }
    if (pIStack_38 != (IPalObject *)0x0) {
      (*pIStack_38->_vptr_IPalObject[8])(pIStack_38,pTargetThread);
    }
    return local_3c;
  }
  abort();
}

Assistant:

BOOL
PALAPI
SetThreadContext(
           IN HANDLE hThread,
           IN CONST CONTEXT *lpContext)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    CPalThread *pTargetThread;
    IPalObject *pobjThread = NULL;
    BOOL ret = FALSE;

    PERF_ENTRY(SetThreadContext);
    ENTRY("SetThreadContext (hThread=%p, lpContext=%p)\n",hThread,lpContext);

    pThread = InternalGetCurrentThread();

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0, // THREAD_SET_CONTEXT
        &pTargetThread,
        &pobjThread
        );

    if (NO_ERROR == palError)
    {
        if (!pTargetThread->IsDummy())
        {
            ret = CONTEXT_SetThreadContext(
                GetCurrentProcessId(),
                pTargetThread->GetPThreadSelf(),
                lpContext
                );
        }
        else
        {
            ASSERT("Dummy thread handle passed to SetThreadContext\n");
            pThread->SetLastError(ERROR_INVALID_HANDLE);
        }
    }
    else
    {
        pThread->SetLastError(palError);
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    return ret;
}